

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst_debug_printf_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::InstDebugPrintfPass::ProcessImpl(InstDebugPrintfPass *this)

{
  bool bVar1;
  DefUseManager *this_00;
  Instruction *pIVar2;
  IRContext *pIVar3;
  Operand *this_01;
  undefined1 local_78 [8];
  string set_name;
  undefined1 local_50 [8];
  inst_iterator c_itr;
  bool non_sem_set_seen;
  Instruction *ext_inst_import_inst;
  undefined1 local_30 [8];
  InstProcessFunction pfn;
  InstDebugPrintfPass *this_local;
  
  ext_inst_import_inst = (Instruction *)this;
  pfn._M_invoker = (_Invoker_type)this;
  std::
  function<void(spvtools::opt::InstructionList::iterator,spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,unsigned_int,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>*)>
  ::function<spvtools::opt::InstDebugPrintfPass::ProcessImpl()::__0,void>
            ((function<void(spvtools::opt::InstructionList::iterator,spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,unsigned_int,std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>*)>
              *)local_30,(anon_class_8_1_8991fb9c *)&ext_inst_import_inst);
  InstrumentPass::InstProcessEntryPointCallTree
            (&this->super_InstrumentPass,(InstProcessFunction *)local_30);
  this_00 = Pass::get_def_use_mgr((Pass *)this);
  pIVar2 = analysis::DefUseManager::GetDef
                     (this_00,*(uint32_t *)&(this->super_InstrumentPass).field_0x244);
  pIVar3 = Pass::context((Pass *)this);
  IRContext::KillInst(pIVar3,pIVar2);
  c_itr.super_iterator.node_._7_1_ = 0;
  pIVar3 = Pass::context((Pass *)this);
  IRContext::module(pIVar3);
  Module::ext_inst_import_begin((Module *)local_50);
  while( true ) {
    pIVar3 = Pass::context((Pass *)this);
    IRContext::module(pIVar3);
    Module::ext_inst_import_end((Module *)((long)&set_name.field_2 + 8));
    bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_50,
                              (iterator_template<spvtools::opt::Instruction> *)
                              ((long)&set_name.field_2 + 8));
    if (!bVar1) break;
    pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)local_50);
    this_01 = Instruction::GetInOperand(pIVar2,0);
    Operand::AsString_abi_cxx11_((string *)local_78,this_01);
    bVar1 = utils::starts_with((string *)local_78,"NonSemantic.");
    if (bVar1) {
      c_itr.super_iterator.node_._7_1_ = 1;
    }
    std::__cxx11::string::~string((string *)local_78);
    if (bVar1) break;
    InstructionList::iterator::operator++((iterator *)local_50);
  }
  if ((c_itr.super_iterator.node_._7_1_ & 1) == 0) {
    pIVar3 = Pass::context((Pass *)this);
    IRContext::RemoveExtension(pIVar3,kSPV_KHR_non_semantic_info);
  }
  std::
  function<void_(spvtools::opt::InstructionList::iterator,_spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,_false>,_unsigned_int,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_*)>
  ::~function((function<void_(spvtools::opt::InstructionList::iterator,_spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,_false>,_unsigned_int,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_*)>
               *)local_30);
  return SuccessWithChange;
}

Assistant:

Pass::Status InstDebugPrintfPass::ProcessImpl() {
  // Perform printf instrumentation on each entry point function in module
  InstProcessFunction pfn =
      [this](BasicBlock::iterator ref_inst_itr,
             UptrVectorIterator<BasicBlock> ref_block_itr,
             [[maybe_unused]] uint32_t stage_idx,
             std::vector<std::unique_ptr<BasicBlock>>* new_blocks) {
        return GenDebugPrintfCode(ref_inst_itr, ref_block_itr, new_blocks);
      };
  (void)InstProcessEntryPointCallTree(pfn);
  // Remove DebugPrintf OpExtInstImport instruction
  Instruction* ext_inst_import_inst =
      get_def_use_mgr()->GetDef(ext_inst_printf_id_);
  context()->KillInst(ext_inst_import_inst);
  // If no remaining non-semantic instruction sets, remove non-semantic debug
  // info extension from module and feature manager
  bool non_sem_set_seen = false;
  for (auto c_itr = context()->module()->ext_inst_import_begin();
       c_itr != context()->module()->ext_inst_import_end(); ++c_itr) {
    const std::string set_name = c_itr->GetInOperand(0).AsString();
    if (spvtools::utils::starts_with(set_name, "NonSemantic.")) {
      non_sem_set_seen = true;
      break;
    }
  }
  if (!non_sem_set_seen) {
    context()->RemoveExtension(kSPV_KHR_non_semantic_info);
  }
  return Status::SuccessWithChange;
}